

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

Am_Code_Flag ml_which_code(Am_Object *text)

{
  Am_Value *in_value;
  Am_Font local_38;
  Am_Font font;
  bool local_27;
  bool local_26;
  bool local_25;
  Am_Font_Size_Flag size;
  bool is_underline;
  bool is_italic;
  bool is_bold;
  Am_Font_Family_Flag family;
  Am_String font_name;
  Am_Object *text_local;
  
  font_name.data = (Am_String_Data *)text;
  Am_String::Am_String((Am_String *)&stack0xffffffffffffffe0);
  in_value = Am_Object::Get(text,0xac,0);
  Am_Font::Am_Font(&local_38,in_value);
  Am_Font::Get(&local_38,(Am_String *)&stack0xffffffffffffffe0,&size,&local_25,&local_26,&local_27,
               (Am_Font_Size_Flag *)((long)&font.data + 4));
  text_local._4_4_ = (Am_Code_Flag)(2 < (int)size);
  Am_Font::~Am_Font(&local_38);
  Am_String::~Am_String((Am_String *)&stack0xffffffffffffffe0);
  return text_local._4_4_;
}

Assistant:

Am_Code_Flag
ml_which_code(Am_Object text)
{
  Am_String font_name;
  Am_Font_Family_Flag family;
  bool is_bold, is_italic, is_underline;
  Am_Font_Size_Flag size;

  Am_Font font = text.Get(Am_FONT);

  font.Get(font_name, family, is_bold, is_italic, is_underline, size);
  if ((int)family < (int)Am_FONT_JFIXED)
    return (Am_ONE_BYTE_CODE);
  else { // We use the Shift-JIS code on PC, and two-byte codes on X
#ifdef _WIN32
    return (Am_SHIFT_JIS_CODE);
#else
    return (Am_TWO_BYTE_CODE);
#endif
  }
}